

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbopl.cpp
# Opt level: O0

void __thiscall DBOPL::Chip::Chip(Chip *this)

{
  Channel *local_18;
  Chip *this_local;
  
  local_18 = this->chan;
  do {
    Channel::Channel(local_18);
    local_18 = local_18 + 1;
  } while (local_18 != (Channel *)&this->reg104);
  this->reg08 = '\0';
  this->reg04 = '\0';
  this->regBD = '\0';
  this->reg104 = '\0';
  this->opl3Active = '\0';
  return;
}

Assistant:

Chip::Chip() {
	reg08 = 0;
	reg04 = 0;
	regBD = 0;
	reg104 = 0;
	opl3Active = 0;
}